

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall Spaghetti<RemSP>::PerformLabeling(Spaghetti<RemSP> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  uint *puVar8;
  int iVar9;
  int iLabel_3;
  int iLabel_2;
  int c_5;
  uint *img_labels_row_5;
  uchar *img_row_5;
  int iLabel_1;
  int iLabel;
  int c_4;
  uint *img_labels_row_fol;
  uint *img_labels_row_4;
  uchar *img_row_fol_2;
  uchar *img_row_4;
  int r;
  int c_3;
  uint *img_labels_row_prev_prev_1;
  uint *img_labels_row_3;
  uchar *img_row_prev_prev_1;
  uchar *img_row_prev_1;
  uchar *img_row_3;
  int r_2;
  int c_2;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_2;
  uchar *img_row_fol_1;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_2;
  int r_1;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_fol;
  uchar *img_row_1;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  Size local_90;
  Mat_<int> local_88;
  byte local_25;
  uint local_24;
  bool o_cols;
  int e_cols;
  uint uStack_18;
  bool o_rows;
  int e_rows;
  int w;
  int h;
  Spaghetti<RemSP> *this_local;
  
  e_rows = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uStack_18 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  e_cols = e_rows & 0xfffffffe;
  o_cols = e_rows % 2 == 1;
  local_24 = uStack_18 & 0xfffffffe;
  local_25 = (int)uStack_18 % 2 == 1;
  _w = this;
  cv::MatSize::operator()((MatSize *)&local_90);
  cv::Mat_<int>::Mat_(&local_88,&local_90);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_88)
  ;
  cv::Mat_<int>::~Mat_(&local_88);
  RemSP::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
               / 2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                 field_0xc + 1) / 2) + 1);
  RemSP::Setup();
  if (e_rows == 1) {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,0);
    img_row_1._4_4_ = -2;
LAB_0017b9db:
    iVar5 = img_row_1._4_4_ + 2;
    if (iVar5 < (int)(uStack_18 - 2)) {
      if (puVar7[iVar5] == '\0') goto LAB_0017ba9a;
      if (puVar7[img_row_1._4_4_ + 3] == '\0') {
        uVar6 = RemSP::NewLabel();
        puVar8[iVar5] = uVar6;
        img_row_1._4_4_ = iVar5;
      }
      else {
        uVar6 = RemSP::NewLabel();
        puVar8[iVar5] = uVar6;
        img_row_1._4_4_ = iVar5;
        while( true ) {
          while( true ) {
            iVar5 = img_row_1._4_4_ + 2;
            if ((int)(uStack_18 - 2) <= iVar5) {
              if ((int)(uStack_18 - 2) < iVar5) {
                if (puVar7[iVar5] == '\0') {
                  puVar8[iVar5] = 0;
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_1._4_4_];
                }
              }
              else {
                if (puVar7[iVar5] == '\0') goto LAB_0017bcbb;
                if (puVar7[img_row_1._4_4_ + 3] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_1._4_4_];
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_1._4_4_];
                }
              }
              goto LAB_0018373f;
            }
            if (puVar7[iVar5] == '\0') break;
            if (puVar7[img_row_1._4_4_ + 3] == '\0') {
              puVar8[iVar5] = puVar8[img_row_1._4_4_];
              img_row_1._4_4_ = iVar5;
              goto LAB_0017b9db;
            }
            puVar8[iVar5] = puVar8[img_row_1._4_4_];
            img_row_1._4_4_ = iVar5;
          }
LAB_0017ba9a:
          img_row_1._4_4_ = iVar5;
          if (puVar7[img_row_1._4_4_ + 1] == '\0') break;
          uVar6 = RemSP::NewLabel();
          puVar8[img_row_1._4_4_] = uVar6;
        }
        puVar8[img_row_1._4_4_] = 0;
      }
      goto LAB_0017b9db;
    }
    if ((int)(uStack_18 - 2) < iVar5) {
      if (puVar7[iVar5] == '\0') {
        puVar8[iVar5] = 0;
      }
      else {
        uVar6 = RemSP::NewLabel();
        puVar8[iVar5] = uVar6;
      }
    }
    else if (puVar7[iVar5] == '\0') {
LAB_0017bcbb:
      img_row_1._4_4_ = iVar5;
      if (puVar7[img_row_1._4_4_ + 1] == '\0') {
        puVar8[img_row_1._4_4_] = 0;
      }
      else {
        uVar6 = RemSP::NewLabel();
        puVar8[img_row_1._4_4_] = uVar6;
      }
    }
    else if (puVar7[img_row_1._4_4_ + 3] == '\0') {
      uVar6 = RemSP::NewLabel();
      puVar8[iVar5] = uVar6;
    }
    else {
      uVar6 = RemSP::NewLabel();
      puVar8[iVar5] = uVar6;
    }
  }
  else {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,0);
    img_row_2._4_4_ = -2;
LAB_0017bdf6:
    img_row_2._4_4_ = img_row_2._4_4_ + 2;
    iVar5 = img_row_2._4_4_;
    if (img_row_2._4_4_ < (int)(uStack_18 - 2)) {
      if ((puVar7[img_row_2._4_4_] == '\0') && (puVar7[img_row_2._4_4_ + lVar1] == '\0'))
      goto LAB_0017beb3;
LAB_0017be42:
      if (puVar7[img_row_2._4_4_ + 1] == '\0') {
        uVar6 = RemSP::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
        goto LAB_0017c017;
      }
      uVar6 = RemSP::NewLabel();
      puVar8[img_row_2._4_4_] = uVar6;
LAB_0017bf39:
      do {
        iVar5 = img_row_2._4_4_ + 2;
        if ((int)(uStack_18 - 2) <= iVar5) {
          if ((int)(uStack_18 - 2) < iVar5) {
            if (puVar7[iVar5] == '\0') {
              if (puVar7[iVar5 + lVar1] == '\0') {
                puVar8[iVar5] = 0;
              }
              else {
                puVar8[iVar5] = puVar8[img_row_2._4_4_];
              }
            }
            else {
              puVar8[iVar5] = puVar8[img_row_2._4_4_];
            }
          }
          else {
            img_row_2._4_4_ = iVar5;
            if ((puVar7[iVar5] == '\0') && (puVar7[iVar5 + lVar1] == '\0')) goto LAB_0017c3db;
LAB_0017c480:
            if (puVar7[img_row_2._4_4_ + 1] == '\0') {
              puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
            }
            else {
              puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
            }
          }
          goto LAB_0017c590;
        }
        img_row_2._4_4_ = iVar5;
        if ((puVar7[iVar5] == '\0') && (puVar7[iVar5 + lVar1] == '\0')) {
LAB_0017beb3:
          img_row_2._4_4_ = iVar5;
          if (puVar7[img_row_2._4_4_ + 1] == '\0') {
            if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
              puVar8[img_row_2._4_4_] = 0;
              goto LAB_0017bdf6;
            }
            uVar6 = RemSP::NewLabel();
            puVar8[img_row_2._4_4_] = uVar6;
          }
          else {
            uVar6 = RemSP::NewLabel();
            puVar8[img_row_2._4_4_] = uVar6;
          }
        }
        else {
          while (puVar7[img_row_2._4_4_ + 1] == '\0') {
            puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
LAB_0017c017:
            while( true ) {
              iVar5 = img_row_2._4_4_ + 2;
              if ((int)(uStack_18 - 2) <= iVar5) {
                if ((int)(uStack_18 - 2) < iVar5) {
                  if ((puVar7[iVar5] == '\0') && (puVar7[iVar5 + lVar1] == '\0')) {
                    puVar8[iVar5] = 0;
                    goto LAB_0017c590;
                  }
                }
                else {
                  if (puVar7[iVar5] != '\0') {
                    iVar9 = img_row_2._4_4_ + 1;
                    img_row_2._4_4_ = iVar5;
                    if (puVar7[iVar9 + lVar1] != '\0') goto LAB_0017c480;
                    goto LAB_0017c36d;
                  }
                  if (puVar7[iVar5 + lVar1] == '\0') goto LAB_0017c3db;
                }
                if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                  uVar6 = RemSP::NewLabel();
                  puVar8[iVar5] = uVar6;
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_2._4_4_];
                }
                goto LAB_0017c590;
              }
              if (puVar7[iVar5] != '\0') break;
              if (puVar7[iVar5 + lVar1] == '\0') goto LAB_0017beb3;
              if (puVar7[img_row_2._4_4_ + 3] != '\0') {
                if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                  uVar6 = RemSP::NewLabel();
                  puVar8[iVar5] = uVar6;
                  img_row_2._4_4_ = iVar5;
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_2._4_4_];
                  img_row_2._4_4_ = iVar5;
                }
                goto LAB_0017bf39;
              }
              if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                uVar6 = RemSP::NewLabel();
                puVar8[iVar5] = uVar6;
                img_row_2._4_4_ = iVar5;
              }
              else {
                puVar8[iVar5] = puVar8[img_row_2._4_4_];
                img_row_2._4_4_ = iVar5;
              }
            }
            iVar9 = img_row_2._4_4_ + 1;
            img_row_2._4_4_ = iVar5;
            if (puVar7[iVar9 + lVar1] == '\0') goto LAB_0017be42;
          }
          puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
        }
      } while( true );
    }
    if ((int)(uStack_18 - 2) < img_row_2._4_4_) {
      if (puVar7[img_row_2._4_4_] == '\0') {
        if (puVar7[img_row_2._4_4_ + lVar1] == '\0') {
          puVar8[img_row_2._4_4_] = 0;
        }
        else {
          uVar6 = RemSP::NewLabel();
          puVar8[img_row_2._4_4_] = uVar6;
        }
      }
      else {
        uVar6 = RemSP::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
    }
    else if ((puVar7[img_row_2._4_4_] == '\0') && (puVar7[img_row_2._4_4_ + lVar1] == '\0')) {
LAB_0017c3db:
      img_row_2._4_4_ = iVar5;
      if (puVar7[img_row_2._4_4_ + 1] == '\0') {
        if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
          puVar8[img_row_2._4_4_] = 0;
        }
        else {
          uVar6 = RemSP::NewLabel();
          puVar8[img_row_2._4_4_] = uVar6;
        }
      }
      else {
        uVar6 = RemSP::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
    }
    else {
LAB_0017c36d:
      if (puVar7[img_row_2._4_4_ + 1] == '\0') {
        uVar6 = RemSP::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
      else {
        uVar6 = RemSP::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
    }
LAB_0017c590:
    for (img_row_2._0_4_ = 2; (int)img_row_2 < e_cols; img_row_2._0_4_ = (int)img_row_2 + 2) {
      puVar7 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          (int)img_row_2);
      lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar1;
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      puVar8 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,(int)img_row_2);
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      iVar5 = 0;
      img_row_3._4_4_ = 0;
      if (0 < (int)(uStack_18 - 2)) {
        if (*puVar7 == '\0') goto LAB_0017c8dc;
LAB_0017c6ca:
        img_row_3._4_4_ = iVar5;
        if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0017c72f;
          if (puVar7[img_row_3._4_4_ - lVar1] != '\0') {
            puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            goto LAB_0017ece8;
          }
          uVar6 = RemSP::NewLabel();
          puVar8[img_row_3._4_4_] = uVar6;
          goto LAB_0017ebea;
        }
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
LAB_0017f266:
        do {
          iVar5 = img_row_3._4_4_ + 2;
          if ((int)(uStack_18 - 2) <= iVar5) {
            if ((int)(uStack_18 - 2) < iVar5) {
              if (puVar7[iVar5] == '\0') {
                if (puVar7[iVar5 + lVar2] == '\0') {
                  puVar8[iVar5] = 0;
                }
                else {
LAB_001801d2:
                  if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') {
                    if (puVar7[img_row_3._4_4_ + 1] == '\0') {
                      uVar6 = RemSP::NewLabel();
                      puVar8[iVar5] = uVar6;
                    }
                    else {
                      puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    }
                  }
                  else {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  }
                }
              }
              else if (puVar7[img_row_3._4_4_ + 1] == '\0') {
                if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') {
LAB_0018014a:
                  if (puVar7[iVar5 - lVar1] == '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                  }
                  else {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                  }
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                }
              }
              else {
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
              }
              goto LAB_00181404;
            }
            if (puVar7[iVar5] == '\0') {
              if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0018043f;
              if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_001801d2;
              if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_00180c9b;
              if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0018039f;
              if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                if (puVar7[iVar5 - lVar1] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                }
                else {
                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                }
                goto LAB_00181404;
              }
            }
            else {
              if ((puVar7[img_row_3._4_4_ + 1] == '\0') &&
                 (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0')) {
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') goto LAB_0018014a;
                img_row_3._4_4_ = iVar5;
                if (puVar7[iVar5 - lVar1] == '\0') {
LAB_00180551:
                  if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                  (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                                         *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4)
                                        );
                    puVar8[img_row_3._4_4_] = uVar6;
                  }
                  else {
                    puVar8[img_row_3._4_4_] =
                         *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                  }
                }
                else {
                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                }
                goto LAB_00181404;
              }
LAB_00180c9b:
              img_row_3._4_4_ = iVar5;
              iVar5 = img_row_3._4_4_;
              if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                goto LAB_00181404;
              }
            }
LAB_00180cbd:
            img_row_3._4_4_ = iVar5;
            if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
              if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                     puVar8[img_row_3._4_4_ + -2]);
                puVar8[img_row_3._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
            }
            else {
              puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            }
            goto LAB_00181404;
          }
          if (puVar7[iVar5] == '\0') {
            if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0017c97c;
            if (puVar7[img_row_3._4_4_ + 3] == '\0') {
              if (puVar7[(img_row_3._4_4_ + 1) + lVar2] != '\0') {
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_0017e663;
              }
              if (puVar7[img_row_3._4_4_ + 1] != '\0') {
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_0017e663;
              }
              uVar6 = RemSP::NewLabel();
              puVar8[iVar5] = uVar6;
              img_row_3._4_4_ = iVar5;
              goto LAB_0017e663;
            }
            if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0017e54e;
            if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017c915;
            if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') goto LAB_0017e570;
            if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') goto LAB_0017e37f;
            if (puVar7[iVar5 - lVar1] != '\0') {
              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
              img_row_3._4_4_ = iVar5;
              goto LAB_0017da2c;
            }
            puVar8[iVar5] = puVar8[img_row_3._4_4_];
            img_row_3._4_4_ = iVar5;
LAB_0017d708:
            do {
              iVar5 = img_row_3._4_4_ + 2;
              if ((int)(uStack_18 - 2) <= iVar5) {
                if ((int)(uStack_18 - 2) < iVar5) {
LAB_0017fe2c:
                  img_row_3._4_4_ = iVar5;
                  if (puVar7[img_row_3._4_4_] == '\0') {
LAB_0017fdd0:
                    if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
                      puVar8[img_row_3._4_4_] = 0;
                    }
                    else {
                      puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                    }
                  }
                  else {
                    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                  }
                  goto LAB_00181404;
                }
                if (puVar7[iVar5] == '\0') {
                  if (puVar7[iVar5 + lVar2] == '\0') {
LAB_0018099a:
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[img_row_3._4_4_ + 1] == '\0') goto LAB_00180462;
                    if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                      uVar6 = RemSP::NewLabel();
                      puVar8[img_row_3._4_4_] = uVar6;
                    }
                    else {
                      puVar8[img_row_3._4_4_] =
                           *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                    }
                    goto LAB_00181404;
                  }
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    goto LAB_00181404;
                  }
                }
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                }
                else {
                  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                       puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                }
                goto LAB_00181404;
              }
              if (puVar7[iVar5] != '\0') {
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_0017f665;
                  }
LAB_0017d7d8:
                  if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                  (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                         puVar8[img_row_3._4_4_]);
                    puVar8[iVar5] = uVar6;
                    img_row_3._4_4_ = iVar5;
                    goto LAB_0017def5;
                  }
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0017e79e;
                }
                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                     puVar8[img_row_3._4_4_]);
                puVar8[iVar5] = uVar6;
                img_row_3._4_4_ = iVar5;
                goto LAB_0017f266;
              }
              if (puVar7[iVar5 + lVar2] != '\0') {
                if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0017e663;
                }
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                       puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0017e209;
                }
                goto LAB_0017d7d8;
              }
LAB_0017d95f:
              img_row_3._4_4_ = iVar5;
              iVar5 = img_row_3._4_4_;
              if (puVar7[img_row_3._4_4_ + 1] == '\0') goto LAB_0017c99f;
              if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                goto LAB_0017e209;
              }
              if (puVar7[(img_row_3._4_4_ + 2) - lVar1] != '\0') {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
LAB_0017def5:
                iVar5 = img_row_3._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if ((int)(uStack_18 - 2) < iVar5) goto LAB_0017fe2c;
                  if (puVar7[iVar5] == '\0') {
                    if (puVar7[iVar5 + lVar2] == '\0') {
                      iVar9 = img_row_3._4_4_ + 3;
                      img_row_3._4_4_ = iVar5;
                      if (puVar7[iVar9] == '\0') goto LAB_00180462;
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                      goto LAB_00181404;
                    }
                    if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                      puVar8[iVar5] = puVar8[img_row_3._4_4_];
                      goto LAB_00181404;
                    }
                  }
                  if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  }
                  else {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                  }
                  goto LAB_00181404;
                }
                if (puVar7[iVar5] == '\0') {
                  if (puVar7[iVar5 + lVar2] == '\0') {
                    if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_0017c99f;
                    if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                      img_row_3._4_4_ = iVar5;
                      goto LAB_0017e209;
                    }
                    iVar9 = img_row_3._4_4_ + 4;
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[iVar9 - lVar1] == '\0') {
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                      goto LAB_0017da2c;
                    }
LAB_0017c76c:
                    if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                    (long)img_row_3._4_4_ * 4 + lVar4),
                                           *(uint *)((long)puVar8 +
                                                    (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
                      puVar8[img_row_3._4_4_] = uVar6;
                    }
                    else {
                      puVar8[img_row_3._4_4_] =
                           *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
                    }
                    goto LAB_0017def5;
                  }
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_0017e663;
                  }
                  if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                    img_row_3._4_4_ = iVar5;
                    goto LAB_0017e209;
                  }
                }
                else {
                  if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                    img_row_3._4_4_ = iVar5;
                    goto LAB_0017f266;
                  }
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_0017f665;
                  }
                }
                if (puVar7[(img_row_3._4_4_ + 4) - lVar1] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
LAB_0017e79e:
                  do {
                    iVar5 = img_row_3._4_4_ + 2;
                    if ((int)(uStack_18 - 2) <= iVar5) {
                      if ((int)(uStack_18 - 2) < iVar5) goto LAB_0017fe2c;
                      if (puVar7[iVar5] == '\0') {
                        if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0018099a;
                        if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                          puVar8[iVar5] = puVar8[img_row_3._4_4_];
                          goto LAB_00181404;
                        }
                      }
                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                      }
                      else if (puVar7[iVar5 + lVar3] == '\0') {
                        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                             puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                      }
                      else {
LAB_001802ea:
                        img_row_3._4_4_ = iVar5;
                        iVar5 = img_row_3._4_4_;
                        if (puVar7[(img_row_3._4_4_ + -2) - lVar1] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                        (long)img_row_3._4_4_ * 4 + lVar4),
                                               puVar8[img_row_3._4_4_ + -2]);
                          puVar8[img_row_3._4_4_] = uVar6;
                        }
                        else {
LAB_0017ffe5:
                          img_row_3._4_4_ = iVar5;
                          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                          (long)img_row_3._4_4_ * 4 + lVar4),
                                                 puVar8[img_row_3._4_4_ + -2]);
                            puVar8[img_row_3._4_4_] = uVar6;
                          }
                          else {
                            puVar8[img_row_3._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                          }
                        }
                      }
                      goto LAB_00181404;
                    }
                    if (puVar7[iVar5] == '\0') {
                      if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0017d95f;
                      if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                        img_row_3._4_4_ = iVar5;
                        goto LAB_0017e663;
                      }
                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                        if (puVar7[iVar5 + lVar3] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                               puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
                        else {
                          if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_0017ddf4;
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                               puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
LAB_0017e209:
                        do {
                          iVar5 = img_row_3._4_4_ + 2;
                          if ((int)(uStack_18 - 2) <= iVar5) {
                            if ((int)(uStack_18 - 2) < iVar5) goto LAB_0017fe2c;
                            if (puVar7[iVar5] != '\0') goto LAB_00180c9b;
                            if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0018043f;
                            if (puVar7[img_row_3._4_4_ + 3] != '\0') goto LAB_00180c9b;
                            puVar8[iVar5] = puVar8[img_row_3._4_4_];
                            goto LAB_00181404;
                          }
                          if (puVar7[iVar5] != '\0') goto LAB_0017e259;
                          if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0017c97c;
                          if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                            puVar8[iVar5] = puVar8[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar5;
LAB_0017e663:
                            iVar5 = img_row_3._4_4_ + 2;
                            if (iVar5 < (int)(uStack_18 - 2)) {
                              if (puVar7[iVar5] != '\0') {
                                iVar9 = img_row_3._4_4_ + 1;
                                img_row_3._4_4_ = iVar5;
                                if (puVar7[iVar9 + lVar2] == '\0') goto LAB_0017ca3d;
                                goto LAB_0017cea0;
                              }
LAB_0017e6d5:
                              img_row_3._4_4_ = iVar5;
                              iVar5 = img_row_3._4_4_;
                              if (puVar7[img_row_3._4_4_ + lVar2] == '\0') goto LAB_0017c97c;
                              if (puVar7[img_row_3._4_4_ + 1] != '\0') {
                                if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0')
                                goto LAB_0017c915;
LAB_0017d52a:
                                img_row_3._4_4_ = iVar5;
                                if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
LAB_0017d58c:
                                  if (puVar7[(img_row_3._4_4_ + 2) - lVar1] == '\0') {
LAB_0017d378:
                                    if (puVar7[img_row_3._4_4_ - lVar1] != '\0') {
                                      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar4),
                                                           puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
LAB_0017da2c:
                                      iVar5 = img_row_3._4_4_ + 2;
                                      if (iVar5 < (int)(uStack_18 - 2)) {
                                        if (puVar7[iVar5] != '\0') {
                                          if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0')
                                          goto LAB_0017db82;
                                          if (puVar7[iVar5 + lVar3] != '\0') goto LAB_0017dab7;
                                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                        (long)iVar5 * 4 + lVar4),
                                                               puVar8[img_row_3._4_4_]);
                                          puVar8[iVar5] = uVar6;
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_0017f266;
                                        }
                                        if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0017d95f;
                                        if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                                          puVar8[iVar5] = puVar8[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_0017e663;
                                        }
                                        if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0')
                                        goto LAB_0017dba4;
                                        if (puVar7[iVar5 + lVar3] == '\0') {
                                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                        (long)iVar5 * 4 + lVar4),
                                                               puVar8[img_row_3._4_4_]);
                                          puVar8[iVar5] = uVar6;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else {
LAB_0017ddf4:
                                          img_row_3._4_4_ = iVar5;
                                          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                          (long)img_row_3._4_4_ * 4
                                                                          + lVar4),
                                                                 puVar8[img_row_3._4_4_ + -2]);
                                            puVar8[img_row_3._4_4_] = uVar6;
                                          }
                                          else {
                                            puVar8[img_row_3._4_4_] =
                                                 *(uint *)((long)puVar8 +
                                                          (long)img_row_3._4_4_ * 4 + lVar4);
                                          }
                                        }
                                        goto LAB_0017e209;
                                      }
                                      if ((int)(uStack_18 - 2) < iVar5) goto LAB_0017fe2c;
                                      if (puVar7[iVar5] == '\0') {
                                        if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0018099a;
                                        if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                                          puVar8[iVar5] = puVar8[img_row_3._4_4_];
                                          goto LAB_00181404;
                                        }
                                      }
                                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                                      }
                                      else {
                                        if (puVar7[iVar5 + lVar3] != '\0') goto LAB_0017ffe5;
                                        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                      (long)iVar5 * 4 + lVar4),
                                                             puVar8[img_row_3._4_4_]);
                                        puVar8[iVar5] = uVar6;
                                      }
                                      goto LAB_00181404;
                                    }
                                    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                                    goto LAB_0017d708;
                                  }
                                  if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                                    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                    (long)(img_row_3._4_4_ + 2) * 4
                                                                    + lVar4),
                                                           puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                    else {
                                      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar4),
                                                           *(uint *)((long)puVar8 +
                                                                    (long)(img_row_3._4_4_ + 2) * 4
                                                                    + lVar4));
                                      uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                  }
                                  else {
                                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                  (long)(img_row_3._4_4_ + 2) * 4 +
                                                                  lVar4),
                                                         puVar8[img_row_3._4_4_ + -2]);
                                    puVar8[img_row_3._4_4_] = uVar6;
                                  }
                                  goto LAB_0017def5;
                                }
                                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                              (long)img_row_3._4_4_ * 4 + lVar4),
                                                     puVar8[img_row_3._4_4_ + -2]);
                                puVar8[img_row_3._4_4_] = uVar6;
                                goto LAB_0017e209;
                              }
LAB_0017e734:
                              img_row_3._4_4_ = iVar5;
                              if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0') {
                                uVar6 = RemSP::NewLabel();
                                puVar8[img_row_3._4_4_] = uVar6;
                              }
                              else {
                                puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                              }
                              goto LAB_0017e663;
                            }
                            if ((int)(uStack_18 - 2) < iVar5) {
                              if (puVar7[iVar5] == '\0') {
LAB_0017feb5:
                                img_row_3._4_4_ = iVar5;
                                iVar5 = img_row_3._4_4_;
                                if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
                                  puVar8[img_row_3._4_4_] = 0;
                                }
                                else {
LAB_0017fece:
                                  img_row_3._4_4_ = iVar5;
                                  if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0') {
                                    uVar6 = RemSP::NewLabel();
                                    puVar8[img_row_3._4_4_] = uVar6;
                                  }
                                  else {
                                    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                                  }
                                }
                                goto LAB_00181404;
                              }
                              iVar9 = img_row_3._4_4_ + 1;
                              img_row_3._4_4_ = iVar5;
                              if (puVar7[iVar9 + lVar2] == '\0') goto LAB_0017fc21;
LAB_0017fce4:
                              if (puVar7[(img_row_3._4_4_ + -1) - lVar1] != '\0') {
                                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                              (long)(img_row_3._4_4_ + -2) * 4 +
                                                              lVar4),puVar8[img_row_3._4_4_ + -2]);
                                puVar8[img_row_3._4_4_] = uVar6;
                                goto LAB_00181404;
                              }
                            }
                            else {
                              if (puVar7[iVar5] != '\0') {
                                iVar9 = img_row_3._4_4_ + 1;
                                img_row_3._4_4_ = iVar5;
                                if (puVar7[iVar9 + lVar2] == '\0') {
LAB_001804d5:
                                  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
LAB_0017fc21:
                                    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                                        uVar6 = RemSP::NewLabel();
                                        puVar8[img_row_3._4_4_] = uVar6;
                                      }
                                      else {
                                        puVar8[img_row_3._4_4_] =
                                             *(uint *)((long)puVar8 +
                                                      (long)(img_row_3._4_4_ + -2) * 4 + lVar4);
                                      }
                                    }
                                    else {
                                      puVar8[img_row_3._4_4_] =
                                           *(uint *)((long)puVar8 +
                                                    (long)img_row_3._4_4_ * 4 + lVar4);
                                    }
                                    goto LAB_00181404;
                                  }
                                  if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                    if (puVar7[(img_row_3._4_4_ + -1) - lVar1] != '\0')
                                    goto LAB_00180551;
                                    puVar8[img_row_3._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4)
                                    ;
                                  }
                                  else {
                                    puVar8[img_row_3._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4)
                                    ;
                                  }
                                }
                                else {
LAB_00180621:
                                  img_row_3._4_4_ = iVar5;
                                  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0')
                                  goto LAB_0017fce4;
                                  if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                    if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                                      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar4),
                                                           puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                    else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                                      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                    (long)(img_row_3._4_4_ + -2) * 4
                                                                    + lVar4),
                                                           *(uint *)((long)puVar8 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar4));
                                      uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                    else {
                                      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                    (long)img_row_3._4_4_ * 4 +
                                                                    lVar4),
                                                           puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                  }
                                  else {
                                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                  (long)img_row_3._4_4_ * 4 + lVar4)
                                                         ,puVar8[img_row_3._4_4_ + -2]);
                                    puVar8[img_row_3._4_4_] = uVar6;
                                  }
                                }
                                goto LAB_00181404;
                              }
LAB_00180e4b:
                              img_row_3._4_4_ = iVar5;
                              iVar5 = img_row_3._4_4_;
                              if (puVar7[img_row_3._4_4_ + lVar2] == '\0') goto LAB_0018043f;
                              if (puVar7[img_row_3._4_4_ + 1] == '\0') goto LAB_0017fece;
LAB_00180e80:
                              iVar5 = img_row_3._4_4_;
                              if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0') goto LAB_0018039f;
LAB_001807f8:
                              img_row_3._4_4_ = iVar5;
                              if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
                                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                              (long)img_row_3._4_4_ * 4 + lVar4),
                                                     puVar8[img_row_3._4_4_ + -2]);
                                puVar8[img_row_3._4_4_] = uVar6;
                                goto LAB_00181404;
                              }
                            }
LAB_0017fd4b:
                            if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                              puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                            }
                            else {
                              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                            (long)img_row_3._4_4_ * 4 + lVar4),
                                                   puVar8[img_row_3._4_4_ + -2]);
                              puVar8[img_row_3._4_4_] = uVar6;
                            }
                            goto LAB_00181404;
                          }
LAB_0017e54e:
                          img_row_3._4_4_ = iVar5;
                          iVar5 = img_row_3._4_4_;
                          if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') goto LAB_0017e35d;
LAB_0017e570:
                          img_row_3._4_4_ = iVar5;
                          if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                            if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                            (long)img_row_3._4_4_ * 4 + lVar4),
                                                   puVar8[img_row_3._4_4_ + -2]);
                              puVar8[img_row_3._4_4_] = uVar6;
                            }
                            else {
                              puVar8[img_row_3._4_4_] =
                                   *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                            }
                          }
                          else {
                            puVar8[img_row_3._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                          }
                        } while( true );
                      }
                    }
                    else {
                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                        if (puVar7[iVar5 + lVar3] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                               puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
                        else if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                               puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
                        else {
LAB_0017dab7:
                          img_row_3._4_4_ = iVar5;
                          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                          (long)img_row_3._4_4_ * 4 + lVar4),
                                                 puVar8[img_row_3._4_4_ + -2]);
                            puVar8[img_row_3._4_4_] = uVar6;
                          }
                          else {
                            puVar8[img_row_3._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                          }
                        }
                        goto LAB_0017f266;
                      }
                      if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                        img_row_3._4_4_ = iVar5;
                        goto LAB_0017f665;
                      }
                    }
                    if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
                      if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
                        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                      (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                             puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                        img_row_3._4_4_ = iVar5;
                      }
                      else if (puVar7[iVar5 + lVar3] == '\0') {
                        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                      (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                             puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                        img_row_3._4_4_ = iVar5;
                      }
                      else if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                      (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                             puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                        img_row_3._4_4_ = iVar5;
                      }
                      else {
LAB_0017dc01:
                        img_row_3._4_4_ = iVar5;
                        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                        (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                                               puVar8[img_row_3._4_4_ + -2]);
                          puVar8[img_row_3._4_4_] = uVar6;
                        }
                        else {
                          puVar8[img_row_3._4_4_] =
                               *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
                        }
                      }
                      goto LAB_0017def5;
                    }
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                  } while( true );
                }
                if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
                  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                       puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                  img_row_3._4_4_ = iVar5;
                }
                else {
                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4);
                  img_row_3._4_4_ = iVar5;
                }
                goto LAB_0017def5;
              }
              uVar6 = RemSP::NewLabel();
              puVar8[img_row_3._4_4_] = uVar6;
            } while( true );
          }
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0017e259;
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] != '\0') goto LAB_0017e259;
          if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
            if (puVar7[img_row_3._4_4_ + 3] == '\0') {
              if (puVar7[iVar5 - lVar1] != '\0') {
                puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                img_row_3._4_4_ = iVar5;
                goto LAB_0017ece8;
              }
              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              img_row_3._4_4_ = iVar5;
              goto LAB_0017ebea;
            }
            if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
              img_row_3._4_4_ = iVar5;
              if (puVar7[iVar5 - lVar1] != '\0') goto LAB_0017c76c;
              goto LAB_0017cbe4;
            }
            if (puVar7[iVar5 - lVar1] != '\0') {
              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
              img_row_3._4_4_ = iVar5;
              goto LAB_0017da2c;
            }
            puVar8[iVar5] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            img_row_3._4_4_ = iVar5;
            goto LAB_0017d708;
          }
          img_row_3._4_4_ = iVar5;
          if (puVar7[iVar5 - lVar1] == '\0') {
LAB_0017cabd:
            if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4
                                            ),
                                   *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4));
              puVar8[img_row_3._4_4_] = uVar6;
            }
            else {
              puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            }
          }
          else {
            puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
          }
        } while( true );
      }
      img_row_3._4_4_ = iVar5;
      if ((int)(uStack_18 - 2) < 0) {
        if (*puVar7 == '\0') {
LAB_0017fbb7:
          if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
            puVar8[img_row_3._4_4_] = 0;
          }
          else {
            uVar6 = RemSP::NewLabel();
            puVar8[img_row_3._4_4_] = uVar6;
          }
          goto LAB_00181404;
        }
LAB_0017fb60:
        img_row_3._4_4_ = iVar5;
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = RemSP::NewLabel();
          puVar8[img_row_3._4_4_] = uVar6;
        }
        else {
          puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
        }
      }
      else if (*puVar7 == '\0') {
LAB_001803eb:
        iVar5 = img_row_3._4_4_;
        if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
LAB_0018043f:
          img_row_3._4_4_ = iVar5;
          iVar5 = img_row_3._4_4_;
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0018039f;
LAB_00180462:
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') {
            puVar8[img_row_3._4_4_] = 0;
          }
          else {
            uVar6 = RemSP::NewLabel();
            puVar8[img_row_3._4_4_] = uVar6;
          }
        }
        else {
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0018039f;
          uVar6 = RemSP::NewLabel();
          puVar8[img_row_3._4_4_] = uVar6;
        }
      }
      else {
LAB_0018039f:
        img_row_3._4_4_ = iVar5;
        iVar5 = img_row_3._4_4_;
        if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') goto LAB_0017fb60;
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
      }
LAB_00181404:
    }
    if ((o_cols & 1U) != 0) {
      iVar5 = e_rows + -1;
      puVar7 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          iVar5);
      lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar2 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar1;
      puVar8 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,iVar5);
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      img_row_4._4_4_ = -2;
LAB_001814e6:
      iVar5 = img_row_4._4_4_ + 2;
      if (iVar5 < (int)(uStack_18 - 2)) {
        if (puVar7[iVar5] == '\0') goto LAB_00181746;
        if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
          puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
          img_row_4._4_4_ = iVar5;
          goto LAB_00182760;
        }
        iVar9 = img_row_4._4_4_ + 3;
        img_row_4._4_4_ = iVar5;
        if (puVar7[iVar9] != '\0') {
LAB_00181599:
          if (puVar7[(img_row_4._4_4_ + 2) - lVar1] != '\0') {
            iVar5 = img_row_4._4_4_;
            if (puVar7[img_row_4._4_4_ - lVar1] != '\0') goto LAB_001815d6;
            puVar8[img_row_4._4_4_] =
                 *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
            goto LAB_001821df;
          }
          if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
            uVar6 = RemSP::NewLabel();
            puVar8[img_row_4._4_4_] = uVar6;
            goto LAB_00181c20;
          }
          puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
LAB_00181e8f:
          iVar5 = img_row_4._4_4_ + 2;
          if (iVar5 < (int)(uStack_18 - 2)) {
            if (puVar7[iVar5] == '\0') goto LAB_00181dad;
            if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
              if (puVar7[iVar5 + lVar2] != '\0') goto LAB_00181f1a;
              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                   puVar8[img_row_4._4_4_]);
              puVar8[iVar5] = uVar6;
              img_row_4._4_4_ = iVar5;
              goto LAB_00182760;
            }
            if (puVar7[img_row_4._4_4_ + 3] != '\0') {
              if (puVar7[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                puVar8[iVar5] = puVar8[img_row_4._4_4_];
                img_row_4._4_4_ = iVar5;
                goto LAB_00182964;
              }
              if (puVar7[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                              (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                     puVar8[img_row_4._4_4_]);
                puVar8[iVar5] = uVar6;
                img_row_4._4_4_ = iVar5;
                goto LAB_001821df;
              }
              if (puVar7[iVar5 + lVar2] == '\0') {
                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                              (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                     puVar8[img_row_4._4_4_]);
                puVar8[iVar5] = uVar6;
                img_row_4._4_4_ = iVar5;
                goto LAB_001821df;
              }
LAB_00182062:
              img_row_4._4_4_ = iVar5;
              if (puVar7[(img_row_4._4_4_ + -1) + lVar2] == '\0') {
                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                              (long)(img_row_4._4_4_ + 2) * 4 + lVar3),
                                     puVar8[img_row_4._4_4_ + -2]);
                puVar8[img_row_4._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_4._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
              }
LAB_001821df:
              do {
                iVar5 = img_row_4._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if ((int)(uStack_18 - 2) < iVar5) goto LAB_00182dbd;
                  if (puVar7[iVar5] == '\0') {
                    if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                      puVar8[iVar5] = 0;
                    }
                    else {
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    }
                  }
                  else if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_4._4_4_];
                  }
                  else {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                  }
                  goto LAB_0018373f;
                }
                if (puVar7[iVar5] == '\0') {
                  if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = 0;
                    img_row_4._4_4_ = iVar5;
                    goto LAB_001817bf;
                  }
                  if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                    goto LAB_0018245b;
                  }
                  if (puVar7[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                    goto LAB_00181e8f;
                  }
LAB_001815d6:
                  img_row_4._4_4_ = iVar5;
                  if (puVar7[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3)
                                         ,*(uint *)((long)puVar8 +
                                                   (long)(img_row_4._4_4_ + 2) * 4 + lVar3));
                    puVar8[img_row_4._4_4_] = uVar6;
                  }
                  else {
                    puVar8[img_row_4._4_4_] =
                         *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
                  }
                }
                else {
                  if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                    goto LAB_00182760;
                  }
                  if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_4._4_4_];
                    img_row_4._4_4_ = iVar5;
                    goto LAB_001814e6;
                  }
                  if (puVar7[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_4._4_4_];
                    img_row_4._4_4_ = iVar5;
LAB_00182964:
                    do {
                      iVar5 = img_row_4._4_4_ + 2;
                      if ((int)(uStack_18 - 2) <= iVar5) {
                        if ((int)(uStack_18 - 2) < iVar5) goto LAB_00182dbd;
                        if (puVar7[iVar5] == '\0') goto LAB_00183185;
                        if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                          puVar8[iVar5] = puVar8[img_row_4._4_4_];
                          goto LAB_0018373f;
                        }
                        if (puVar7[iVar5 + lVar2] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                        }
                        else {
                          if (puVar7[img_row_4._4_4_ - lVar1] != '\0') goto LAB_0018326f;
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                        }
                        goto LAB_0018373f;
                      }
                      if (puVar7[iVar5] == '\0') goto LAB_00181dad;
                      if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                        if (puVar7[iVar5 + lVar2] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        else if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        else {
LAB_00181f1a:
                          img_row_4._4_4_ = iVar5;
                          if (puVar7[(img_row_4._4_4_ + -1) + lVar2] == '\0') {
                            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                          (long)(img_row_4._4_4_ + -2) * 4 + lVar3),
                                                 *(uint *)((long)puVar8 +
                                                          (long)img_row_4._4_4_ * 4 + lVar3));
                            puVar8[img_row_4._4_4_] = uVar6;
                          }
                          else {
                            puVar8[img_row_4._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                          }
                        }
LAB_00182760:
                        do {
                          iVar5 = img_row_4._4_4_ + 2;
                          if ((int)(uStack_18 - 2) <= iVar5) {
                            if ((int)(uStack_18 - 2) < iVar5) {
                              if (puVar7[iVar5] == '\0') {
                                puVar8[iVar5] = 0;
                                goto LAB_0018373f;
                              }
                              if (puVar7[img_row_4._4_4_ + 1] != '\0') {
                                puVar8[iVar5] = puVar8[img_row_4._4_4_];
                                goto LAB_0018373f;
                              }
                            }
                            else {
                              if (puVar7[iVar5] == '\0') goto LAB_00182f5b;
                              if (puVar7[img_row_4._4_4_ + 1] != '\0') {
LAB_0018345d:
                                img_row_4._4_4_ = iVar5;
                                if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                  puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
                                }
                                else if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                                  if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                  (long)img_row_4._4_4_ * 4 + lVar3)
                                                         ,puVar8[img_row_4._4_4_ + -2]);
                                    puVar8[img_row_4._4_4_] = uVar6;
                                  }
                                  else {
                                    puVar8[img_row_4._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3)
                                    ;
                                  }
                                }
                                else {
                                  puVar8[img_row_4._4_4_] =
                                       *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                                }
                                goto LAB_0018373f;
                              }
                              if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                                img_row_4._4_4_ = iVar5;
                                if (puVar7[iVar5 - lVar1] == '\0') {
LAB_0018302c:
                                  if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                  (long)(img_row_4._4_4_ + -2) * 4 +
                                                                  lVar3),
                                                         *(uint *)((long)puVar8 +
                                                                  (long)img_row_4._4_4_ * 4 + lVar3)
                                                        );
                                    puVar8[img_row_4._4_4_] = uVar6;
                                  }
                                  else {
                                    puVar8[img_row_4._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3)
                                    ;
                                  }
                                }
                                else {
                                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                }
                                goto LAB_0018373f;
                              }
                            }
                            if (puVar7[iVar5 - lVar1] == '\0') {
                              puVar8[iVar5] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                            }
                            else {
                              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                            }
                            goto LAB_0018373f;
                          }
                          if (puVar7[iVar5] == '\0') goto LAB_00181746;
                          if (puVar7[img_row_4._4_4_ + 1] != '\0') {
LAB_001824ab:
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                              if (puVar7[img_row_4._4_4_ + 1] == '\0') {
                                puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
                                goto LAB_001814e6;
                              }
                              if (puVar7[(img_row_4._4_4_ + 2) - lVar1] == '\0') {
                                puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
                                goto LAB_00182964;
                              }
                              if (puVar7[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                              (long)(img_row_4._4_4_ + 2) * 4 +
                                                              lVar3),puVar8[img_row_4._4_4_ + -2]);
                                puVar8[img_row_4._4_4_] = uVar6;
                              }
                              else if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                                if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                                (long)(img_row_4._4_4_ + 2) * 4 +
                                                                lVar3),puVar8[img_row_4._4_4_ + -2])
                                  ;
                                  puVar8[img_row_4._4_4_] = uVar6;
                                }
                                else {
                                  puVar8[img_row_4._4_4_] =
                                       *(uint *)((long)puVar8 +
                                                (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
                                }
                              }
                              else {
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 +
                                              (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
                              }
                              goto LAB_001821df;
                            }
                            if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                              if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                              (long)img_row_4._4_4_ * 4 + lVar3),
                                                     puVar8[img_row_4._4_4_ + -2]);
                                puVar8[img_row_4._4_4_] = uVar6;
                              }
                              else {
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              }
                            }
                            else {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                            }
                            goto LAB_00182760;
                          }
                          if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[iVar5 - lVar1] == '\0') {
LAB_0018188d:
                              if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                              (long)(img_row_4._4_4_ + -2) * 4 +
                                                              lVar3),
                                                     *(uint *)((long)puVar8 +
                                                              (long)img_row_4._4_4_ * 4 + lVar3));
                                puVar8[img_row_4._4_4_] = uVar6;
                              }
                              else {
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              }
                            }
                            else {
                              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                            }
                            goto LAB_00182760;
                          }
                          if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                            if (puVar7[iVar5 - lVar1] == '\0') {
                              puVar8[iVar5] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              img_row_4._4_4_ = iVar5;
                            }
                            else {
                              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                              img_row_4._4_4_ = iVar5;
                            }
                            goto LAB_001814e6;
                          }
                          if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                            if (puVar7[iVar5 - lVar1] != '\0') goto LAB_001815d6;
LAB_001819b4:
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                            (long)(img_row_4._4_4_ + -2) * 4 + lVar3
                                                            ),
                                                   *(uint *)((long)puVar8 +
                                                            (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                                                  );
                              puVar8[img_row_4._4_4_] = uVar6;
                            }
                            else if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                            (long)(img_row_4._4_4_ + -2) * 4 + lVar3
                                                            ),
                                                   *(uint *)((long)puVar8 +
                                                            (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                                                  );
                              puVar8[img_row_4._4_4_] = uVar6;
                            }
                            else {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                              ;
                            }
                            goto LAB_001821df;
                          }
                          if (puVar7[iVar5 - lVar1] != '\0') {
                            puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                            img_row_4._4_4_ = iVar5;
                            goto LAB_00181e8f;
                          }
                          puVar8[iVar5] =
                               *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                          img_row_4._4_4_ = iVar5;
LAB_00181c20:
                          iVar5 = img_row_4._4_4_ + 2;
                          if ((int)(uStack_18 - 2) <= iVar5) {
                            if ((int)(uStack_18 - 2) < iVar5) goto LAB_00182dbd;
                            if (puVar7[iVar5] == '\0') goto LAB_00183185;
                            if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                              puVar8[iVar5] = puVar8[img_row_4._4_4_];
                            }
                            else {
                              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3)
                                                   ,puVar8[img_row_4._4_4_]);
                              puVar8[iVar5] = uVar6;
                            }
                            goto LAB_0018373f;
                          }
                          if (puVar7[iVar5] == '\0') {
LAB_00181dad:
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[img_row_4._4_4_ + 1] == '\0') {
                              puVar8[img_row_4._4_4_] = 0;
                              goto LAB_001817bf;
                            }
                            if (puVar7[(img_row_4._4_4_ + 1) - lVar1] != '\0') {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
LAB_0018245b:
                              while (iVar5 = img_row_4._4_4_ + 2, iVar5 < (int)(uStack_18 - 2)) {
                                if (puVar7[iVar5] != '\0') goto LAB_001824ab;
LAB_00181746:
                                while (img_row_4._4_4_ = iVar5, puVar7[img_row_4._4_4_ + 1] == '\0')
                                {
                                  puVar8[img_row_4._4_4_] = 0;
LAB_001817bf:
                                  iVar5 = img_row_4._4_4_ + 2;
                                  if ((int)(uStack_18 - 2) <= iVar5) {
                                    if ((int)(uStack_18 - 2) < iVar5) {
                                      if (puVar7[iVar5] == '\0') {
                                        puVar8[iVar5] = 0;
                                        goto LAB_0018373f;
                                      }
                                    }
                                    else {
                                      if (puVar7[iVar5] == '\0') goto LAB_00182f5b;
                                      if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                                        if (puVar7[iVar5 - lVar1] == '\0') {
                                          iVar9 = img_row_4._4_4_ + 1;
                                          img_row_4._4_4_ = iVar5;
                                          if (puVar7[iVar9 - lVar1] != '\0') goto LAB_0018302c;
                                          puVar8[iVar5] =
                                               *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        }
                                        else {
                                          puVar8[iVar5] =
                                               *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        }
                                        goto LAB_0018373f;
                                      }
                                    }
                                    if (puVar7[iVar5 - lVar1] == '\0') {
                                      if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                        uVar6 = RemSP::NewLabel();
                                        puVar8[iVar5] = uVar6;
                                      }
                                      else {
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 +
                                                      (long)img_row_4._4_4_ * 4 + lVar3);
                                      }
                                    }
                                    else {
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                    }
                                    goto LAB_0018373f;
                                  }
                                  if (puVar7[iVar5] != '\0') {
                                    if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                                      if (puVar7[iVar5 - lVar1] == '\0') {
                                        iVar9 = img_row_4._4_4_ + 1;
                                        img_row_4._4_4_ = iVar5;
                                        if (puVar7[iVar9 - lVar1] != '\0') goto LAB_0018188d;
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                      }
                                      else {
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        img_row_4._4_4_ = iVar5;
                                      }
                                      goto LAB_00182760;
                                    }
                                    if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                                      if (puVar7[iVar5 - lVar1] == '\0') {
                                        if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                          uVar6 = RemSP::NewLabel();
                                          puVar8[iVar5] = uVar6;
                                          img_row_4._4_4_ = iVar5;
                                        }
                                        else {
                                          puVar8[iVar5] =
                                               *(uint *)((long)puVar8 +
                                                        (long)img_row_4._4_4_ * 4 + lVar3);
                                          img_row_4._4_4_ = iVar5;
                                        }
                                      }
                                      else {
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        img_row_4._4_4_ = iVar5;
                                      }
                                      goto LAB_001814e6;
                                    }
                                    if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                                      if (puVar7[iVar5 - lVar1] != '\0') goto LAB_001815d6;
                                      if (puVar7[(img_row_4._4_4_ + 1) - lVar1] != '\0')
                                      goto LAB_001819b4;
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 +
                                                    (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                                      img_row_4._4_4_ = iVar5;
                                      goto LAB_001821df;
                                    }
                                    if (puVar7[iVar5 - lVar1] != '\0') {
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                      img_row_4._4_4_ = iVar5;
                                      goto LAB_00181e8f;
                                    }
                                    if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                      uVar6 = RemSP::NewLabel();
                                      puVar8[iVar5] = uVar6;
                                      img_row_4._4_4_ = iVar5;
                                    }
                                    else {
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 +
                                                    (long)img_row_4._4_4_ * 4 + lVar3);
                                      img_row_4._4_4_ = iVar5;
                                    }
                                    goto LAB_00181c20;
                                  }
                                }
                                if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0')
                                goto LAB_00181599;
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              }
                              if ((int)(uStack_18 - 2) < iVar5) goto LAB_00182dbd;
                              if (puVar7[iVar5] != '\0') goto LAB_0018345d;
                              goto LAB_00182f5b;
                            }
                            if (puVar7[(img_row_4._4_4_ + 2) - lVar1] != '\0') {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                              ;
                              goto LAB_001821df;
                            }
                            uVar6 = RemSP::NewLabel();
                            puVar8[img_row_4._4_4_] = uVar6;
                            goto LAB_00181c20;
                          }
                          if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') goto LAB_00181cce;
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        } while( true );
                      }
                      if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_4._4_4_];
                        img_row_4._4_4_ = iVar5;
                        goto LAB_001814e6;
                      }
                      if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                        if (puVar7[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                        (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                          goto LAB_001821df;
                        }
                        if (puVar7[iVar5 + lVar2] == '\0') {
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                        (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        else {
                          if (puVar7[img_row_4._4_4_ - lVar1] != '\0') goto LAB_00182062;
                          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                        (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                               puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        goto LAB_001821df;
                      }
                      puVar8[iVar5] = puVar8[img_row_4._4_4_];
                      img_row_4._4_4_ = iVar5;
                    } while( true );
                  }
                  if (puVar7[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                  (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                         puVar8[img_row_4._4_4_]);
                    puVar8[iVar5] = uVar6;
                    img_row_4._4_4_ = iVar5;
                  }
                  else {
                    puVar8[iVar5] =
                         *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                  }
                }
              } while( true );
            }
            puVar8[iVar5] = puVar8[img_row_4._4_4_];
            img_row_4._4_4_ = iVar5;
            goto LAB_001814e6;
          }
          if ((int)(uStack_18 - 2) < iVar5) {
LAB_00182dbd:
            img_row_4._4_4_ = iVar5;
            if (puVar7[img_row_4._4_4_] == '\0') {
              puVar8[img_row_4._4_4_] = 0;
            }
            else {
              puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
            }
          }
          else if (puVar7[iVar5] == '\0') {
LAB_00183185:
            img_row_4._4_4_ = iVar5;
            if (puVar7[img_row_4._4_4_ + 1] == '\0') {
              puVar8[img_row_4._4_4_] = 0;
            }
            else if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
              uVar6 = RemSP::NewLabel();
              puVar8[img_row_4._4_4_] = uVar6;
            }
            else {
              puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
            }
          }
          else if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
            puVar8[iVar5] = puVar8[img_row_4._4_4_];
          }
          else if (puVar7[iVar5 + lVar2] == '\0') {
            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                 puVar8[img_row_4._4_4_]);
            puVar8[iVar5] = uVar6;
          }
          else {
LAB_0018326f:
            img_row_4._4_4_ = iVar5;
            if (puVar7[(img_row_4._4_4_ + -1) + lVar2] == '\0') {
              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + -2) * 4 + lVar3
                                            ),
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3));
              puVar8[img_row_4._4_4_] = uVar6;
            }
            else {
              puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
            }
          }
          goto LAB_0018373f;
        }
        if (puVar7[iVar5 - lVar1] == '\0') {
          uVar6 = RemSP::NewLabel();
          puVar8[iVar5] = uVar6;
        }
        else {
          puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
        }
        goto LAB_001814e6;
      }
      if ((int)(uStack_18 - 2) < iVar5) {
        img_row_4._4_4_ = iVar5;
        if (puVar7[iVar5] == '\0') {
          puVar8[iVar5] = 0;
          goto LAB_0018373f;
        }
      }
      else {
        img_row_4._4_4_ = iVar5;
        if (puVar7[iVar5] == '\0') {
LAB_00182f5b:
          img_row_4._4_4_ = iVar5;
          if (puVar7[img_row_4._4_4_ + 1] == '\0') {
            puVar8[img_row_4._4_4_] = 0;
            goto LAB_0018373f;
          }
        }
        if (puVar7[(img_row_4._4_4_ + 1) - lVar1] != '\0') {
          puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
          goto LAB_0018373f;
        }
      }
      if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
        uVar6 = RemSP::NewLabel();
        puVar8[img_row_4._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
      }
    }
  }
LAB_0018373f:
  uVar6 = RemSP::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  for (img_row_4._0_4_ = 0; (int)img_row_4 < e_cols; img_row_4._0_4_ = (int)img_row_4 + 2) {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_4);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_4);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iLabel_1 = 0; iLabel_1 < (int)local_24; iLabel_1 = iLabel_1 + 2) {
      if ((int)puVar8[iLabel_1] < 1) {
        puVar8[iLabel_1] = 0;
        puVar8[iLabel_1 + 1] = 0;
        *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
        *(undefined4 *)((long)puVar8 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
      }
      else {
        uVar6 = RemSP::GetLabel(puVar8[iLabel_1]);
        if (puVar7[iLabel_1] == '\0') {
          puVar8[iLabel_1] = 0;
        }
        else {
          puVar8[iLabel_1] = uVar6;
        }
        if (puVar7[iLabel_1 + 1] == '\0') {
          puVar8[iLabel_1 + 1] = 0;
        }
        else {
          puVar8[iLabel_1 + 1] = uVar6;
        }
        if (puVar7[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = uVar6;
        }
        if (puVar7[(iLabel_1 + 1) + lVar1] == '\0') {
          *(undefined4 *)((long)puVar8 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar8 + (long)(iLabel_1 + 1) * 4 + lVar2) = uVar6;
        }
      }
    }
    if ((local_25 & 1) != 0) {
      if ((int)puVar8[iLabel_1] < 1) {
        puVar8[iLabel_1] = 0;
        *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
      }
      else {
        uVar6 = RemSP::GetLabel(puVar8[iLabel_1]);
        if (puVar7[iLabel_1] == '\0') {
          puVar8[iLabel_1] = 0;
        }
        else {
          puVar8[iLabel_1] = uVar6;
        }
        if (puVar7[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = uVar6;
        }
      }
    }
  }
  if ((o_cols & 1U) != 0) {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_4);
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_4);
    for (iLabel_3 = 0; iLabel_3 < (int)local_24; iLabel_3 = iLabel_3 + 2) {
      if ((int)puVar8[iLabel_3] < 1) {
        puVar8[iLabel_3] = 0;
        puVar8[iLabel_3 + 1] = 0;
      }
      else {
        uVar6 = RemSP::GetLabel(puVar8[iLabel_3]);
        if (puVar7[iLabel_3] == '\0') {
          puVar8[iLabel_3] = 0;
        }
        else {
          puVar8[iLabel_3] = uVar6;
        }
        if (puVar7[iLabel_3 + 1] == '\0') {
          puVar8[iLabel_3 + 1] = 0;
        }
        else {
          puVar8[iLabel_3 + 1] = uVar6;
        }
      }
    }
    if ((local_25 & 1) != 0) {
      if ((int)puVar8[iLabel_3] < 1) {
        puVar8[iLabel_3] = 0;
      }
      else {
        uVar6 = RemSP::GetLabel(puVar8[iLabel_3]);
        if (puVar7[iLabel_3] == '\0') {
          puVar8[iLabel_3] = 0;
        }
        else {
          puVar8[iLabel_3] = uVar6;
        }
      }
    }
  }
  RemSP::Dealloc();
  return;
LAB_0017e259:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
LAB_0017e27b:
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
      }
    }
    else {
      puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
    }
    goto LAB_0017f266;
  }
  if (puVar7[img_row_3._4_4_ + 1] == '\0') {
    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
    goto LAB_0017f665;
  }
LAB_0017e35d:
  iVar5 = img_row_3._4_4_;
  if (puVar7[(img_row_3._4_4_ + 2) - lVar1] != '\0') goto LAB_0017e37f;
  puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
  goto LAB_0017e79e;
LAB_0017db82:
  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
    puVar8[iVar5] = puVar8[img_row_3._4_4_];
    img_row_3._4_4_ = iVar5;
LAB_0017f665:
    iVar5 = img_row_3._4_4_ + 2;
    if ((int)(uStack_18 - 2) <= iVar5) {
      if ((int)(uStack_18 - 2) < iVar5) {
        if (puVar7[iVar5] == '\0') goto LAB_0017feb5;
        if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017fb60;
      }
      else {
        if (puVar7[iVar5] == '\0') {
          if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0018043f;
          if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_0017fece;
        }
        if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0018039f;
        if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
          if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                 puVar8[img_row_3._4_4_]);
            puVar8[iVar5] = uVar6;
            goto LAB_00181404;
          }
LAB_00181058:
          img_row_3._4_4_ = iVar5;
          iVar5 = img_row_3._4_4_;
          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_00180cbd;
          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                               puVar8[img_row_3._4_4_ + -2]);
          puVar8[img_row_3._4_4_] = uVar6;
          goto LAB_00181404;
        }
      }
      if (puVar7[iVar5 - lVar1] != '\0') goto LAB_001802ea;
      puVar8[iVar5] = puVar8[img_row_3._4_4_];
      goto LAB_00181404;
    }
    if (puVar7[iVar5] == '\0') {
      if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0017c97c;
      if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_0017e734;
      if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017c915;
      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                               puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
          goto LAB_0017e209;
        }
LAB_0017f1ed:
        img_row_3._4_4_ = iVar5;
        iVar5 = img_row_3._4_4_;
        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_0017e570;
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
        goto LAB_0017e209;
      }
    }
    else {
      if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017c6ca;
      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                               puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
          goto LAB_0017f266;
        }
LAB_0017ed74:
        img_row_3._4_4_ = iVar5;
        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_0017e27b;
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
        goto LAB_0017f266;
      }
      if (puVar7[img_row_3._4_4_ + 3] == '\0') {
        if (puVar7[iVar5 - lVar1] == '\0') {
          puVar8[iVar5] = puVar8[img_row_3._4_4_];
          img_row_3._4_4_ = iVar5;
          goto LAB_0017ebea;
        }
        if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_0017f0bc;
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                             puVar8[img_row_3._4_4_]);
        puVar8[iVar5] = uVar6;
        img_row_3._4_4_ = iVar5;
LAB_0017ece8:
        while (iVar5 = img_row_3._4_4_ + 2, iVar5 < (int)(uStack_18 - 2)) {
          if (puVar7[iVar5] == '\0') {
            if (puVar7[iVar5 + lVar2] != '\0') {
              if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_0017e734;
              if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017c915;
              if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') goto LAB_0017edfb;
              goto LAB_0017f1ed;
            }
LAB_0017c97c:
            while( true ) {
              while( true ) {
                img_row_3._4_4_ = iVar5;
                iVar5 = img_row_3._4_4_;
                if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0017c915;
LAB_0017c99f:
                img_row_3._4_4_ = iVar5;
                if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') break;
                uVar6 = RemSP::NewLabel();
                puVar8[img_row_3._4_4_] = uVar6;
                iVar5 = img_row_3._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if ((int)(uStack_18 - 2) < iVar5) {
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[iVar5] != '\0') goto LAB_0017fce4;
                    goto LAB_0017fdd0;
                  }
                  if (puVar7[iVar5] != '\0') goto LAB_00180621;
                  if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0018043f;
                  if (puVar7[img_row_3._4_4_ + 3] != '\0') goto LAB_001807f8;
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  goto LAB_00181404;
                }
                if (puVar7[iVar5] != '\0') goto LAB_0017cea0;
                if (puVar7[iVar5 + lVar2] != '\0') {
                  if (puVar7[img_row_3._4_4_ + 3] != '\0') goto LAB_0017d52a;
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0017e663;
                }
              }
              puVar8[img_row_3._4_4_] = 0;
              img_row_3._4_4_ = img_row_3._4_4_ + 2;
              if ((int)(uStack_18 - 2) <= img_row_3._4_4_) {
                if (img_row_3._4_4_ <= (int)(uStack_18 - 2)) {
                  if (puVar7[img_row_3._4_4_] != '\0') goto LAB_001804d5;
                  goto LAB_001803eb;
                }
                if (puVar7[img_row_3._4_4_] != '\0') goto LAB_0017fc21;
                goto LAB_0017fbb7;
              }
              if (puVar7[img_row_3._4_4_] != '\0') break;
LAB_0017c8dc:
              iVar5 = img_row_3._4_4_;
              if (puVar7[img_row_3._4_4_ + lVar2] != '\0') {
                if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0017c915;
                uVar6 = RemSP::NewLabel();
                puVar8[img_row_3._4_4_] = uVar6;
                goto LAB_0017e663;
              }
            }
LAB_0017ca3d:
            if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
              if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                if (puVar7[(img_row_3._4_4_ + -1) - lVar1] != '\0') goto LAB_0017cabd;
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
              goto LAB_0017f266;
            }
            if (puVar7[img_row_3._4_4_ + 1] != '\0') {
              if (puVar7[(img_row_3._4_4_ + 2) - lVar1] == '\0') {
                if (puVar7[img_row_3._4_4_ - lVar1] != '\0') {
                  puVar8[img_row_3._4_4_] =
                       *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                  goto LAB_0017da2c;
                }
                if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                  uVar6 = RemSP::NewLabel();
                  puVar8[img_row_3._4_4_] = uVar6;
                }
                else {
                  puVar8[img_row_3._4_4_] =
                       *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4);
                }
                goto LAB_0017d708;
              }
              if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_0017c76c;
              if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
              }
              else {
LAB_0017cbe4:
                if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                                       *(uint *)((long)puVar8 +
                                                (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
                  puVar8[img_row_3._4_4_] = uVar6;
                }
                else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 +
                                                (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                                       *(uint *)((long)puVar8 +
                                                (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
                  puVar8[img_row_3._4_4_] = uVar6;
                }
                else {
                  puVar8[img_row_3._4_4_] =
                       *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
                }
              }
              goto LAB_0017def5;
            }
            if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
              if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                uVar6 = RemSP::NewLabel();
                puVar8[img_row_3._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4);
              }
              goto LAB_0017ebea;
            }
            puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
          }
          else {
            if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017c6ca;
            if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') goto LAB_0017ed74;
            if (puVar7[img_row_3._4_4_ + 3] != '\0') {
LAB_0017edfb:
              if (puVar7[(img_row_3._4_4_ + 4) - lVar1] == '\0') {
                if (puVar7[iVar5 - lVar1] != '\0') goto LAB_0017efec;
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_0017d708;
              }
              if (puVar7[(img_row_3._4_4_ + 3) + lVar3] != '\0') goto LAB_0017ee39;
              if (puVar7[iVar5 - lVar1] != '\0') goto LAB_0017eec0;
              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4)
                                   ,puVar8[img_row_3._4_4_]);
              puVar8[iVar5] = uVar6;
              img_row_3._4_4_ = iVar5;
              goto LAB_0017def5;
            }
            if (puVar7[iVar5 - lVar1] == '\0') {
              puVar8[iVar5] = puVar8[img_row_3._4_4_];
              img_row_3._4_4_ = iVar5;
LAB_0017ebea:
              while( true ) {
                iVar5 = img_row_3._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if (iVar5 <= (int)(uStack_18 - 2)) {
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[iVar5] != '\0') goto LAB_00180e80;
                    goto LAB_00180e4b;
                  }
                  if (puVar7[iVar5] == '\0') goto LAB_0017feb5;
                  iVar9 = img_row_3._4_4_ + 1;
                  img_row_3._4_4_ = iVar5;
                  if (puVar7[iVar9 + lVar2] != '\0') goto LAB_0017fd4b;
                  goto LAB_0017fb60;
                }
                if (puVar7[iVar5] == '\0') goto LAB_0017e6d5;
                if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017c6ca;
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                       puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0017f266;
                }
                iVar9 = img_row_3._4_4_ + 3;
                img_row_3._4_4_ = iVar5;
                if (puVar7[iVar9] != '\0') goto LAB_0017d58c;
LAB_0017d466:
                if (puVar7[img_row_3._4_4_ - lVar1] != '\0') break;
                puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
              }
              uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                   puVar8[img_row_3._4_4_ + -2]);
              puVar8[img_row_3._4_4_] = uVar6;
            }
            else {
LAB_0017f0bc:
              img_row_3._4_4_ = iVar5;
              if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                     puVar8[img_row_3._4_4_ + -2]);
                puVar8[img_row_3._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
            }
          }
        }
        if ((int)(uStack_18 - 2) < iVar5) {
          if (puVar7[iVar5] == '\0') goto LAB_0017feb5;
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0017fb60;
        }
        else {
          if (puVar7[iVar5] == '\0') {
            if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0018043f;
            if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_0017fece;
          }
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0018039f;
          if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') goto LAB_00181058;
        }
        if (puVar7[iVar5 - lVar1] != '\0') goto LAB_0017ffe5;
        puVar8[iVar5] = puVar8[img_row_3._4_4_];
        goto LAB_00181404;
      }
    }
    if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
      if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
        if (puVar7[iVar5 - lVar1] == '\0') {
          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                               puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
        }
        else if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                               *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4));
          uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
        }
        else {
LAB_0017eec0:
          img_row_3._4_4_ = iVar5;
          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                 *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
            uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
            puVar8[img_row_3._4_4_] = uVar6;
          }
          else {
            uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                                 puVar8[img_row_3._4_4_ + -2]);
            puVar8[img_row_3._4_4_] = uVar6;
          }
        }
      }
      else {
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                               puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
          goto LAB_0017def5;
        }
LAB_0017ee39:
        img_row_3._4_4_ = iVar5;
        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_0017e3a1;
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      goto LAB_0017def5;
    }
    if (puVar7[iVar5 - lVar1] == '\0') {
      puVar8[iVar5] = puVar8[img_row_3._4_4_];
      img_row_3._4_4_ = iVar5;
      goto LAB_0017d708;
    }
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),puVar8[img_row_3._4_4_]
                          );
      puVar8[iVar5] = uVar6;
      img_row_3._4_4_ = iVar5;
    }
    else {
LAB_0017efec:
      img_row_3._4_4_ = iVar5;
      if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
      }
    }
    goto LAB_0017da2c;
  }
LAB_0017dba4:
  if (puVar7[(img_row_3._4_4_ + 4) - lVar1] == '\0') {
    puVar8[iVar5] = puVar8[img_row_3._4_4_];
    img_row_3._4_4_ = iVar5;
    goto LAB_0017e79e;
  }
  if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                         puVar8[img_row_3._4_4_]);
    puVar8[iVar5] = uVar6;
    img_row_3._4_4_ = iVar5;
  }
  else {
    if (puVar7[iVar5 + lVar3] != '\0') goto LAB_0017dc01;
    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                         puVar8[img_row_3._4_4_]);
    puVar8[iVar5] = uVar6;
    img_row_3._4_4_ = iVar5;
  }
  goto LAB_0017def5;
LAB_0017cea0:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                             *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4));
        uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
    }
    else {
      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                           puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
    }
    goto LAB_0017f266;
  }
  if (puVar7[img_row_3._4_4_ + 1] != '\0') {
    if (puVar7[(img_row_3._4_4_ + 2) - lVar1] == '\0') {
      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') goto LAB_0017d378;
      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                           puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
      goto LAB_0017e79e;
    }
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                             *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
        uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                             *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
        uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
    }
    else if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                           *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
      uVar6 = RemSP::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
    }
    else {
      uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                           puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
    }
    goto LAB_0017def5;
  }
  if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') goto LAB_0017d466;
  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                       puVar8[img_row_3._4_4_ + -2]);
  puVar8[img_row_3._4_4_] = uVar6;
  goto LAB_0017f665;
LAB_0017c915:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
    puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
    goto LAB_0017e209;
  }
LAB_0017c72f:
  if (puVar7[(img_row_3._4_4_ + 2) - lVar1] != '\0') {
    if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_0017c76c;
    puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
    goto LAB_0017def5;
  }
  if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
    uVar6 = RemSP::NewLabel();
    puVar8[img_row_3._4_4_] = uVar6;
    goto LAB_0017d708;
  }
  puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
  goto LAB_0017da2c;
LAB_0017e37f:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
    uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                         puVar8[img_row_3._4_4_ + -2]);
    puVar8[img_row_3._4_4_] = uVar6;
  }
  else {
LAB_0017e3a1:
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                             puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
      }
    }
    else {
      puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
    }
  }
  goto LAB_0017def5;
LAB_00181cce:
  if (puVar7[img_row_4._4_4_ + 3] == '\0') {
    puVar8[iVar5] = puVar8[img_row_4._4_4_];
    img_row_4._4_4_ = iVar5;
    goto LAB_001814e6;
  }
  if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') goto code_r0x00181d0a;
  puVar8[iVar5] = puVar8[img_row_4._4_4_];
  img_row_4._4_4_ = iVar5;
  goto LAB_00182964;
code_r0x00181d0a:
  uVar6 = RemSP::Merge(*(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                       puVar8[img_row_4._4_4_]);
  puVar8[iVar5] = uVar6;
  img_row_4._4_4_ = iVar5;
  goto LAB_001821df;
}

Assistant:

void PerformLabeling()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		int e_rows = h & 0xfffffffe;
		bool o_rows = h % 2 == 1;
		int e_cols = w & 0xfffffffe;
		bool o_cols = w % 2 == 1;

		img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

		LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}

		// Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}

		LabelsSolver::Dealloc();

	}